

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

void AnalyzeImplicitModuleImports(ExpressionContext *ctx)

{
  SmallArray<ModuleData_*,_128U> *this;
  uint uVar1;
  ModuleData **ppMVar2;
  ModuleData *pMVar3;
  char *__src;
  long lVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  TraceScope traceScope_1;
  TraceScope traceScope;
  TraceScope local_50;
  TraceScope local_40;
  
  if ((AnalyzeImplicitModuleImports(ExpressionContext&)::token == '\0') &&
     (iVar5 = __cxa_guard_acquire(&AnalyzeImplicitModuleImports(ExpressionContext&)::token),
     iVar5 != 0)) {
    AnalyzeImplicitModuleImports::token =
         NULLC::TraceGetToken("analyze","AnalyzeImplicitModuleImports");
    __cxa_guard_release(&AnalyzeImplicitModuleImports(ExpressionContext&)::token);
  }
  NULLC::TraceScope::TraceScope(&local_40,AnalyzeImplicitModuleImports::token);
  bVar10 = (ctx->uniqueDependencies).count != 0;
  if (bVar10) {
    this = &ctx->implicitImports;
    uVar9 = 0;
    do {
      uVar6 = (ctx->imports).count;
      if (uVar6 != 0) {
        if (!bVar10) goto LAB_0020c889;
        lVar7 = 0;
        do {
          if ((ctx->imports).data[lVar7]->bytecode ==
              (ctx->uniqueDependencies).data[uVar9]->bytecode) goto LAB_0020c6d5;
          lVar7 = lVar7 + 1;
        } while (uVar6 != (uint)lVar7);
      }
      uVar6 = (ctx->implicitImports).count;
      if (uVar6 != 0) {
        if (!bVar10) goto LAB_0020c889;
        lVar7 = 0;
        do {
          if (this->data[lVar7]->bytecode == (ctx->uniqueDependencies).data[uVar9]->bytecode)
          goto LAB_0020c6d5;
          lVar7 = lVar7 + 1;
        } while (uVar6 != (uint)lVar7);
      }
      if (!bVar10) {
LAB_0020c889:
        __assert_fail("index < count",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x199,
                      "T &SmallArray<ModuleData *, 128>::operator[](unsigned int) [T = ModuleData *, N = 128]"
                     );
      }
      ppMVar2 = (ctx->uniqueDependencies).data;
      if (uVar6 == (ctx->implicitImports).max) {
        SmallArray<ModuleData_*,_128U>::grow(this,uVar6);
      }
      if (this->data == (ModuleData **)0x0) {
        __assert_fail("data",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x162,
                      "void SmallArray<ModuleData *, 128>::push_back(const T &) [T = ModuleData *, N = 128]"
                     );
      }
      pMVar3 = ppMVar2[uVar9];
      uVar6 = (ctx->implicitImports).count;
      (ctx->implicitImports).count = uVar6 + 1;
      this->data[uVar6] = pMVar3;
LAB_0020c6d5:
      uVar9 = uVar9 + 1;
      bVar10 = uVar9 < (ctx->uniqueDependencies).count;
    } while (bVar10);
  }
  if ((ctx->implicitImports).count != 0) {
    uVar9 = 0;
    do {
      pMVar3 = (ctx->implicitImports).data[uVar9];
      if ((AnalyzeImplicitModuleImports(ExpressionContext&)::token == '\0') &&
         (iVar5 = __cxa_guard_acquire(&AnalyzeImplicitModuleImports(ExpressionContext&)::token),
         iVar5 != 0)) {
        AnalyzeImplicitModuleImports(ExpressionContext&)::token =
             NULLC::TraceGetToken("analyze","AnalyzeImplicitModuleImport");
        __cxa_guard_release(&AnalyzeImplicitModuleImports(ExpressionContext&)::token);
      }
      NULLC::TraceScope::TraceScope
                (&local_50,AnalyzeImplicitModuleImports(ExpressionContext&)::token);
      lVar7 = NULLC::traceContext;
      __src = (pMVar3->name).begin;
      uVar8 = (long)(pMVar3->name).end - (long)__src;
      iVar5 = (int)uVar8;
      if (iVar5 != 0) {
        uVar6 = iVar5 + 1;
        if ((*(uint *)(NULLC::traceContext + 0x264) <= *(int *)(NULLC::traceContext + 0x260) + uVar6
            ) || (*(int *)(NULLC::traceContext + 0x270) == *(int *)(NULLC::traceContext + 0x274))) {
          NULLC::TraceDump();
        }
        if (*(uint *)(lVar7 + 0x264) <= uVar6) {
          __assert_fail("count + 1 < context.labels.max",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Trace.h"
                        ,0x142,"void NULLC::TraceLabel(const char *, const char *)");
        }
        uVar1 = *(uint *)(lVar7 + 0x260);
        memcpy((void *)((ulong)uVar1 + *(long *)(lVar7 + 0x268)),__src,uVar8 & 0xffffffff);
        *(undefined1 *)(*(long *)(lVar7 + 0x268) + (ulong)(uint)(*(int *)(lVar7 + 0x260) + iVar5)) =
             0;
        *(int *)(lVar7 + 0x260) = *(int *)(lVar7 + 0x260) + uVar6;
        lVar4 = *(long *)(lVar7 + 0x278);
        uVar6 = *(uint *)(lVar7 + 0x270);
        *(uint *)(lVar7 + 0x270) = uVar6 + 1;
        *(uint *)(lVar4 + (ulong)uVar6 * 8) = uVar1 * 4 + 2;
        *(undefined4 *)(lVar4 + 4 + (ulong)uVar6 * 8) = 0;
      }
      ImportModule(ctx,pMVar3->source,pMVar3->bytecode,pMVar3->lexStream,pMVar3->lexStreamSize,
                   pMVar3->name);
      NULLC::TraceScope::~TraceScope(&local_50);
      uVar9 = uVar9 + 1;
    } while (uVar9 < (ctx->implicitImports).count);
  }
  NULLC::TraceScope::~TraceScope(&local_40);
  return;
}

Assistant:

void AnalyzeImplicitModuleImports(ExpressionContext &ctx)
{
	TRACE_SCOPE("analyze", "AnalyzeImplicitModuleImports");

	// Find which transitive dependencies haven't been imported explicitly
	for(unsigned i = 0; i < ctx.uniqueDependencies.size(); i++)
	{
		bool hasImport = false;

		for(unsigned k = 0; k < ctx.imports.size(); k++)
		{
			if(ctx.imports[k]->bytecode == ctx.uniqueDependencies[i]->bytecode)
			{
				hasImport = true;
				break;
			}
		}

		if(hasImport)
			continue;

		bool hasImplicitImport = false;

		for(unsigned k = 0; k < ctx.implicitImports.size(); k++)
		{
			if(ctx.implicitImports[k]->bytecode == ctx.uniqueDependencies[i]->bytecode)
			{
				hasImplicitImport = true;
				break;
			}
		}

		if(hasImplicitImport)
			continue;

		ctx.implicitImports.push_back(ctx.uniqueDependencies[i]);
	}

	// Import additional modules
	for(unsigned i = 0; i < ctx.implicitImports.size(); i++)
	{
		ModuleData *moduleData = ctx.implicitImports[i];

		TRACE_SCOPE("analyze", "AnalyzeImplicitModuleImport");
		TRACE_LABEL2(moduleData->name.begin, moduleData->name.end);

		ImportModule(ctx, moduleData->source, moduleData->bytecode, moduleData->lexStream, moduleData->lexStreamSize, moduleData->name);
	}
}